

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::AnnounceBegin
          (CommissionerSafe *this,ErrorHandler *aHandler,uint32_t aChannelMask,uint8_t aCount,
          uint16_t aPeriod,string *aDstAddr)

{
  anon_class_80_6_556a73da local_98;
  AsyncRequest local_48;
  string *local_28;
  string *aDstAddr_local;
  uint16_t aPeriod_local;
  uint8_t aCount_local;
  uint32_t aChannelMask_local;
  ErrorHandler *aHandler_local;
  CommissionerSafe *this_local;
  
  local_98.this = this;
  local_28 = aDstAddr;
  aDstAddr_local._0_2_ = aPeriod;
  aDstAddr_local._3_1_ = aCount;
  aDstAddr_local._4_4_ = aChannelMask;
  _aPeriod_local = aHandler;
  aHandler_local = (ErrorHandler *)this;
  std::function<void_(ot::commissioner::Error)>::function(&local_98.aHandler,aHandler);
  local_98.aChannelMask = aDstAddr_local._4_4_;
  local_98.aCount = aDstAddr_local._3_1_;
  local_98.aPeriod = (uint16_t)aDstAddr_local;
  std::__cxx11::string::string((string *)&local_98.aDstAddr,(string *)local_28);
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::AnnounceBegin(std::function<void(ot::commissioner::Error)>,unsigned_int,unsigned_char,unsigned_short,std::__cxx11::string_const&)::__0,void>
            ((function<void()> *)&local_48,&local_98);
  PushAsyncRequest(this,&local_48);
  std::function<void_()>::~function(&local_48);
  AnnounceBegin(std::function<void(ot::commissioner::Error)>,unsigned_int,unsigned_char,unsigned_short,std::__cxx11::string_const&)
  ::$_0::~__0((__0 *)&local_98);
  return;
}

Assistant:

void CommissionerSafe::AnnounceBegin(ErrorHandler       aHandler,
                                     uint32_t           aChannelMask,
                                     uint8_t            aCount,
                                     uint16_t           aPeriod,
                                     const std::string &aDstAddr)
{
    PushAsyncRequest([=]() { mImpl->AnnounceBegin(aHandler, aChannelMask, aCount, aPeriod, aDstAddr); });
}